

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-cursor.c
# Opt level: O3

int coda_grib_cursor_goto_array_element_by_index(coda_cursor *cursor,long index)

{
  coda_dynamic_type_struct *pcVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  
  iVar3 = cursor->n;
  pcVar1 = cursor->stack[(long)iVar3 + -1].type;
  piVar4 = (int *)__tls_get_addr(&PTR_001d9fe0);
  if ((*piVar4 == 0) || ((lVar2 = *(long *)(pcVar1 + 1), -1 < index && (index < lVar2)))) {
    cursor->n = iVar3 + 1;
    cursor->stack[iVar3].type = (coda_dynamic_type_struct *)pcVar1[1].definition;
    cursor->stack[iVar3].index = index;
    cursor->stack[iVar3].bit_offset = -1;
    iVar3 = 0;
  }
  else {
    coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld) (%s:%u)",index,lVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                   ,0x54);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int coda_grib_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_grib_value_array *type = (coda_grib_value_array *)cursor->stack[cursor->n - 1].type;

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        if (index < 0 || index >= type->num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld) (%s:%u)",
                           index, type->num_elements, __FILE__, __LINE__);
            return -1;
        }
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].type = type->base_type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = -1;

    return 0;
}